

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

void __thiscall MapLoader::~MapLoader(MapLoader *this)

{
  std::__cxx11::string::~string((string *)&this->filePath);
  return;
}

Assistant:

MapLoader::~MapLoader() {

}